

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

void TestDoubleToExponential(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  char buffer [256];
  StringBuilder local_1f0;
  DoubleToStringConverter local_1d8;
  DoubleToStringConverter local_1a8;
  DoubleToStringConverter local_178;
  DoubleToStringConverter local_148;
  char local_118 [256];
  
  local_1f0.buffer_.start_ = local_118;
  local_1f0.buffer_.length_ = 0x100;
  local_1d8.flags_ = 9;
  local_1d8.infinity_symbol_ = "Infinity";
  local_1d8.nan_symbol_ = "NaN";
  local_1d8.exponent_character_ = 'e';
  local_1d8.decimal_in_shortest_low_ = 0;
  local_1d8.decimal_in_shortest_high_ = 0;
  local_1d8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1d8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1d8.min_exponent_width_ = 0;
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,5,&local_1f0);
  pcVar3 = local_1f0.buffer_.start_;
  if (bVar1) {
    local_1f0.buffer_.start_[local_1f0.position_] = '\0';
    local_1f0.position_ = -1;
    if (local_1f0.buffer_.start_ == (char *)0x0) {
LAB_0083194e:
      local_1f0.position_ = -1;
      abort();
    }
    iVar2 = strcmp("0.00000e+0",local_1f0.buffer_.start_);
    if (iVar2 != 0) {
      pcVar4 = "\"0.00000e+0\"";
      pcVar6 = "0.00000e+0";
      uVar5 = 0x2d0;
LAB_0083228b:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-conversions.cc"
             ,uVar5,pcVar4,"builder.Finalize()",pcVar6,pcVar3);
      abort();
    }
    local_1f0.position_ = 0;
    bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,0,&local_1f0);
    pcVar3 = local_1f0.buffer_.start_;
    if (bVar1) {
      local_1f0.buffer_.start_[local_1f0.position_] = '\0';
      local_1f0.position_ = -1;
      if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
      iVar2 = strcmp("0e+0",local_1f0.buffer_.start_);
      if (iVar2 != 0) {
        pcVar4 = "\"0e+0\"";
        pcVar6 = "0e+0";
        uVar5 = 0x2d4;
        goto LAB_0083228b;
      }
      local_1f0.position_ = 0;
      bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,1,&local_1f0)
      ;
      pcVar3 = local_1f0.buffer_.start_;
      if (bVar1) {
        local_1f0.buffer_.start_[local_1f0.position_] = '\0';
        local_1f0.position_ = -1;
        if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
        iVar2 = strcmp("0.0e+0",local_1f0.buffer_.start_);
        if (iVar2 != 0) {
          pcVar4 = "\"0.0e+0\"";
          pcVar6 = "0.0e+0";
          uVar5 = 0x2d8;
          goto LAB_0083228b;
        }
        local_1f0.position_ = 0;
        bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                          (&local_1d8,0.123456,5,&local_1f0);
        pcVar3 = local_1f0.buffer_.start_;
        if (bVar1) {
          local_1f0.buffer_.start_[local_1f0.position_] = '\0';
          local_1f0.position_ = -1;
          if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
          iVar2 = strcmp("1.23456e-1",local_1f0.buffer_.start_);
          if (iVar2 != 0) {
            pcVar4 = "\"1.23456e-1\"";
            pcVar6 = "1.23456e-1";
            uVar5 = 0x2dc;
            goto LAB_0083228b;
          }
          local_1f0.position_ = 0;
          bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                            (&local_1d8,1.2,1,&local_1f0);
          pcVar3 = local_1f0.buffer_.start_;
          if (bVar1) {
            local_1f0.buffer_.start_[local_1f0.position_] = '\0';
            local_1f0.position_ = -1;
            if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
            iVar2 = strcmp("1.2e+0",local_1f0.buffer_.start_);
            if (iVar2 != 0) {
              pcVar4 = "\"1.2e+0\"";
              pcVar6 = "1.2e+0";
              uVar5 = 0x2e0;
              goto LAB_0083228b;
            }
            local_1f0.position_ = 0;
            bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                              (&local_1d8,-0.0,1,&local_1f0);
            pcVar3 = local_1f0.buffer_.start_;
            if (bVar1) {
              local_1f0.buffer_.start_[local_1f0.position_] = '\0';
              local_1f0.position_ = -1;
              if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
              iVar2 = strcmp("0.0e+0",local_1f0.buffer_.start_);
              if (iVar2 != 0) {
                pcVar4 = "\"0.0e+0\"";
                pcVar6 = "0.0e+0";
                uVar5 = 0x2e4;
                goto LAB_0083228b;
              }
              local_1f0.position_ = 0;
              bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                (&local_1d8,0.0,2,&local_1f0);
              pcVar3 = local_1f0.buffer_.start_;
              if (bVar1) {
                local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                local_1f0.position_ = -1;
                if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                iVar2 = strcmp("0.00e+0",local_1f0.buffer_.start_);
                if (iVar2 != 0) {
                  pcVar4 = "\"0.00e+0\"";
                  pcVar6 = "0.00e+0";
                  uVar5 = 0x2e8;
                  goto LAB_0083228b;
                }
                local_1f0.position_ = 0;
                bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                  (&local_1d8,-0.0,2,&local_1f0);
                pcVar3 = local_1f0.buffer_.start_;
                if (bVar1) {
                  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                  local_1f0.position_ = -1;
                  if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                  iVar2 = strcmp("0.00e+0",local_1f0.buffer_.start_);
                  if (iVar2 != 0) {
                    pcVar4 = "\"0.00e+0\"";
                    pcVar6 = "0.00e+0";
                    uVar5 = 0x2ec;
                    goto LAB_0083228b;
                  }
                  local_1f0.position_ = 0;
                  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                    (&local_1d8,0.0,0x78,&local_1f0);
                  pcVar3 = local_1f0.buffer_.start_;
                  if (bVar1) {
                    local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                    local_1f0.position_ = -1;
                    if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                    iVar2 = strcmp("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000e+0"
                                   ,local_1f0.buffer_.start_);
                    if (iVar2 != 0) {
                      pcVar4 = 
                      "\"0.00000000000000000000000000000000000000000000000000000000000\" \"0000000000000000000000000000000000000000000000000000000000000e+0\""
                      ;
                      pcVar6 = 
                      "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000e+0"
                      ;
                      uVar5 = 0x2f4;
                      goto LAB_0083228b;
                    }
                    local_1f0.position_ = 0;
                    bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                      (&local_1d8,9e+59,0x78,&local_1f0);
                    pcVar3 = local_1f0.buffer_.start_;
                    if (bVar1) {
                      local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                      local_1f0.position_ = -1;
                      if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                      iVar2 = strcmp("8.999999999999999187672294497176199538101312736746906562068480000000000000000000000000000000000000000000000000000000000000e+59"
                                     ,local_1f0.buffer_.start_);
                      if (iVar2 != 0) {
                        pcVar4 = 
                        "\"8.99999999999999918767229449717619953810131273674690656206848\" \"0000000000000000000000000000000000000000000000000000000000000e+59\""
                        ;
                        pcVar6 = 
                        "8.999999999999999187672294497176199538101312736746906562068480000000000000000000000000000000000000000000000000000000000000e+59"
                        ;
                        uVar5 = 0x2fb;
                        goto LAB_0083228b;
                      }
                      local_1f0.position_ = 0;
                      bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                        (&local_1d8,-9e+59,0x78,&local_1f0);
                      pcVar3 = local_1f0.buffer_.start_;
                      if (bVar1) {
                        local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                        local_1f0.position_ = -1;
                        if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                        iVar2 = strcmp("-8.999999999999999187672294497176199538101312736746906562068480000000000000000000000000000000000000000000000000000000000000e+59"
                                       ,local_1f0.buffer_.start_);
                        if (iVar2 != 0) {
                          pcVar4 = 
                          "\"-8.99999999999999918767229449717619953810131273674690656206848\" \"0000000000000000000000000000000000000000000000000000000000000e+59\""
                          ;
                          pcVar6 = 
                          "-8.999999999999999187672294497176199538101312736746906562068480000000000000000000000000000000000000000000000000000000000000e+59"
                          ;
                          uVar5 = 0x302;
                          goto LAB_0083228b;
                        }
                        local_1f0.position_ = 0;
                        bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                          (&local_1d8,1.79769313486232e+308,0x78,&local_1f0);
                        pcVar3 = local_1f0.buffer_.start_;
                        if (bVar1) {
                          local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                          local_1f0.position_ = -1;
                          if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                          iVar2 = strcmp("1.797693134862315708145274237317043567980705675258449965989174768031572607800285387605895586327668781715404589535143824642e+308"
                                         ,local_1f0.buffer_.start_);
                          if (iVar2 != 0) {
                            pcVar4 = 
                            "\"1.79769313486231570814527423731704356798070567525844996598917\" \"4768031572607800285387605895586327668781715404589535143824642e+308\""
                            ;
                            pcVar6 = 
                            "1.797693134862315708145274237317043567980705675258449965989174768031572607800285387605895586327668781715404589535143824642e+308"
                            ;
                            uVar5 = 0x30a;
                            goto LAB_0083228b;
                          }
                          local_1f0.position_ = 0;
                          bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                            (&local_1d8,1e-06,2,&local_1f0);
                          pcVar3 = local_1f0.buffer_.start_;
                          if (bVar1) {
                            local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                            local_1f0.position_ = -1;
                            if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                            iVar2 = strcmp("1.00e-6",local_1f0.buffer_.start_);
                            if (iVar2 != 0) {
                              pcVar4 = "\"1.00e-6\"";
                              pcVar6 = "1.00e-6";
                              uVar5 = 0x30e;
                              goto LAB_0083228b;
                            }
                            local_1f0.position_ = 0;
                            bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                              (&local_1d8,1e-07,2,&local_1f0);
                            pcVar3 = local_1f0.buffer_.start_;
                            if (bVar1) {
                              local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                              local_1f0.position_ = -1;
                              if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                              iVar2 = strcmp("1.00e-7",local_1f0.buffer_.start_);
                              if (iVar2 != 0) {
                                pcVar4 = "\"1.00e-7\"";
                                pcVar6 = "1.00e-7";
                                uVar5 = 0x312;
                                goto LAB_0083228b;
                              }
                              local_1a8.flags_ = 0;
                              local_1a8.infinity_symbol_ = "Infinity";
                              local_1a8.nan_symbol_ = "NaN";
                              local_1a8.exponent_character_ = 'e';
                              local_1a8.decimal_in_shortest_low_ = 0;
                              local_1a8.decimal_in_shortest_high_ = 0;
                              local_1a8.max_leading_padding_zeroes_in_precision_mode_ = 0;
                              local_1a8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
                              local_1a8.min_exponent_width_ = 0;
                              local_1f0.position_ = 0;
                              bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                                (&local_1a8,3.12,1,&local_1f0);
                              pcVar3 = local_1f0.buffer_.start_;
                              if (bVar1) {
                                local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                local_1f0.position_ = -1;
                                if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                                iVar2 = strcmp("3.1e0",local_1f0.buffer_.start_);
                                if (iVar2 != 0) {
                                  pcVar4 = "\"3.1e0\"";
                                  pcVar6 = "3.1e0";
                                  uVar5 = 0x31a;
                                  goto LAB_0083228b;
                                }
                                local_1f0.position_ = 0;
                                bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                                  (&local_1a8,5.0,3,&local_1f0);
                                pcVar3 = local_1f0.buffer_.start_;
                                if (bVar1) {
                                  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                  local_1f0.position_ = -1;
                                  if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                                  iVar2 = strcmp("5.000e0",local_1f0.buffer_.start_);
                                  if (iVar2 != 0) {
                                    pcVar4 = "\"5.000e0\"";
                                    pcVar6 = "5.000e0";
                                    uVar5 = 0x31e;
                                    goto LAB_0083228b;
                                  }
                                  local_1f0.position_ = 0;
                                  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                                                    (&local_1a8,0.001,2,&local_1f0);
                                  pcVar3 = local_1f0.buffer_.start_;
                                  if (bVar1) {
                                    local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                    local_1f0.position_ = -1;
                                    if (local_1f0.buffer_.start_ == (char *)0x0) goto LAB_0083194e;
                                    iVar2 = strcmp("1.00e-3",local_1f0.buffer_.start_);
                                    if (iVar2 != 0) {
                                      pcVar4 = "\"1.00e-3\"";
                                      pcVar6 = "1.00e-3";
                                      uVar5 = 0x322;
                                      goto LAB_0083228b;
                                    }
                                    local_1f0.position_ = 0;
                                    bVar1 = double_conversion::DoubleToStringConverter::
                                            ToExponential(&local_1a8,3.1415,-1,&local_1f0);
                                    pcVar3 = local_1f0.buffer_.start_;
                                    if (bVar1) {
                                      local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                      local_1f0.position_ = -1;
                                      if (local_1f0.buffer_.start_ == (char *)0x0)
                                      goto LAB_0083194e;
                                      iVar2 = strcmp("3.1415e0",local_1f0.buffer_.start_);
                                      if (iVar2 != 0) {
                                        pcVar4 = "\"3.1415e0\"";
                                        pcVar6 = "3.1415e0";
                                        uVar5 = 0x326;
                                        goto LAB_0083228b;
                                      }
                                      local_1f0.position_ = 0;
                                      bVar1 = double_conversion::DoubleToStringConverter::
                                              ToExponential(&local_1a8,3.1415,4,&local_1f0);
                                      pcVar3 = local_1f0.buffer_.start_;
                                      if (bVar1) {
                                        local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                        local_1f0.position_ = -1;
                                        if (local_1f0.buffer_.start_ == (char *)0x0)
                                        goto LAB_0083194e;
                                        iVar2 = strcmp("3.1415e0",local_1f0.buffer_.start_);
                                        if (iVar2 != 0) {
                                          pcVar4 = "\"3.1415e0\"";
                                          pcVar6 = "3.1415e0";
                                          uVar5 = 0x32a;
                                          goto LAB_0083228b;
                                        }
                                        local_1f0.position_ = 0;
                                        bVar1 = double_conversion::DoubleToStringConverter::
                                                ToExponential(&local_1a8,3.1415,3,&local_1f0);
                                        pcVar3 = local_1f0.buffer_.start_;
                                        if (bVar1) {
                                          local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                          local_1f0.position_ = -1;
                                          if (local_1f0.buffer_.start_ == (char *)0x0)
                                          goto LAB_0083194e;
                                          iVar2 = strcmp("3.142e0",local_1f0.buffer_.start_);
                                          if (iVar2 != 0) {
                                            pcVar4 = "\"3.142e0\"";
                                            pcVar6 = "3.142e0";
                                            uVar5 = 0x32e;
                                            goto LAB_0083228b;
                                          }
                                          local_1f0.position_ = 0;
                                          bVar1 = double_conversion::DoubleToStringConverter::
                                                  ToExponential(&local_1a8,123456789000000.0,3,
                                                                &local_1f0);
                                          pcVar3 = local_1f0.buffer_.start_;
                                          if (bVar1) {
                                            local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                            local_1f0.position_ = -1;
                                            if (local_1f0.buffer_.start_ == (char *)0x0)
                                            goto LAB_0083194e;
                                            iVar2 = strcmp("1.235e14",local_1f0.buffer_.start_);
                                            if (iVar2 != 0) {
                                              pcVar4 = "\"1.235e14\"";
                                              pcVar6 = "1.235e14";
                                              uVar5 = 0x332;
                                              goto LAB_0083228b;
                                            }
                                            local_1f0.position_ = 0;
                                            bVar1 = double_conversion::DoubleToStringConverter::
                                                    ToExponential(&local_1a8,1e+30,-1,&local_1f0);
                                            pcVar3 = local_1f0.buffer_.start_;
                                            if (bVar1) {
                                              local_1f0.buffer_.start_[local_1f0.position_] = '\0';
                                              local_1f0.position_ = -1;
                                              if (local_1f0.buffer_.start_ == (char *)0x0)
                                              goto LAB_0083194e;
                                              iVar2 = strcmp("1e30",local_1f0.buffer_.start_);
                                              if (iVar2 != 0) {
                                                pcVar4 = "\"1e30\"";
                                                pcVar6 = "1e30";
                                                uVar5 = 0x336;
                                                goto LAB_0083228b;
                                              }
                                              local_1f0.position_ = 0;
                                              bVar1 = double_conversion::DoubleToStringConverter::
                                                      ToExponential(&local_1a8,1e+30,0x20,&local_1f0
                                                                   );
                                              pcVar3 = local_1f0.buffer_.start_;
                                              if (bVar1) {
                                                local_1f0.buffer_.start_[local_1f0.position_] = '\0'
                                                ;
                                                local_1f0.position_ = -1;
                                                if (local_1f0.buffer_.start_ == (char *)0x0)
                                                goto LAB_0083194e;
                                                iVar2 = strcmp(
                                                  "1.00000000000000001988462483865600e30",
                                                  local_1f0.buffer_.start_);
                                                if (iVar2 != 0) {
                                                  pcVar4 = 
                                                  "\"1.00000000000000001988462483865600e30\"";
                                                  pcVar6 = "1.00000000000000001988462483865600e30";
                                                  uVar5 = 0x33a;
                                                  goto LAB_0083228b;
                                                }
                                                local_1f0.position_ = 0;
                                                bVar1 = double_conversion::DoubleToStringConverter::
                                                        ToExponential(&local_1a8,1234.0,0,&local_1f0
                                                                     );
                                                pcVar3 = local_1f0.buffer_.start_;
                                                if (bVar1) {
                                                  local_1f0.buffer_.start_[local_1f0.position_] =
                                                       '\0';
                                                  local_1f0.position_ = -1;
                                                  if (local_1f0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0083194e;
                                                  iVar2 = strcmp("1e3",local_1f0.buffer_.start_);
                                                  if (iVar2 != 0) {
                                                    pcVar4 = "\"1e3\"";
                                                    pcVar6 = "1e3";
                                                    uVar5 = 0x33e;
                                                    goto LAB_0083228b;
                                                  }
                                                  local_148.flags_ = 0;
                                                  local_148.infinity_symbol_ = (char *)0x0;
                                                  local_148.nan_symbol_ = (char *)0x0;
                                                  local_148.exponent_character_ = 'e';
                                                  local_148.decimal_in_shortest_low_ = 0;
                                                  local_148.decimal_in_shortest_high_ = 0;
                                                  local_148.
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_148.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_148.min_exponent_width_ = 0;
                                                  local_1f0.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToExponential(&local_148,INFINITY,1,
                                                                          &local_1f0);
                                                  if (bVar1) {
                                                    pcVar3 = 
                                                  "!dc3.ToExponential(Double::Infinity(), 1, &builder)"
                                                  ;
                                                  uVar5 = 0x344;
                                                  }
                                                  else {
                                                    local_1f0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToExponential
                                                                      (&local_148,-INFINITY,1,
                                                                       &local_1f0);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc3.ToExponential(-Double::Infinity(), 1, &builder)"
                                                  ;
                                                  uVar5 = 0x347;
                                                  }
                                                  else {
                                                    local_1f0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToExponential
                                                                      (&local_148,NAN,1,&local_1f0);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc3.ToExponential(Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x34a;
                                                  }
                                                  else {
                                                    local_1f0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToExponential
                                                                      (&local_148,-NAN,1,&local_1f0)
                                                    ;
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc3.ToExponential(-Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x34d;
                                                  }
                                                  else {
                                                    local_178.flags_ = 0;
                                                    local_178.infinity_symbol_ = "Infinity";
                                                    local_178.nan_symbol_ = "NaN";
                                                    local_178.exponent_character_ = 'e';
                                                    local_178.decimal_in_shortest_low_ = 0;
                                                    local_178.decimal_in_shortest_high_ = 0;
                                                    local_178.
                                                    max_leading_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_178.
                                                    max_trailing_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_178.min_exponent_width_ = 0;
                                                    local_1f0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToExponential
                                                                      (&local_178,INFINITY,1,
                                                                       &local_1f0);
                                                    pcVar3 = local_1f0.buffer_.start_;
                                                    if (bVar1) {
                                                      local_1f0.buffer_.start_[local_1f0.position_]
                                                           = '\0';
                                                      local_1f0.position_ = -1;
                                                      if (local_1f0.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0083194e;
                                                      iVar2 = strcmp("Infinity",
                                                                     local_1f0.buffer_.start_);
                                                      if (iVar2 == 0) {
                                                        local_1f0.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::
                                                                ToExponential(&local_178,-INFINITY,1
                                                                              ,&local_1f0);
                                                        pcVar3 = local_1f0.buffer_.start_;
                                                        if (!bVar1) {
                                                          pcVar3 = 
                                                  "dc4.ToExponential(-Double::Infinity(), 1, &builder)"
                                                  ;
                                                  uVar5 = 0x356;
                                                  goto LAB_00832253;
                                                  }
                                                  local_1f0.buffer_.start_[local_1f0.position_] =
                                                       '\0';
                                                  local_1f0.position_ = -1;
                                                  if (local_1f0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0083194e;
                                                  iVar2 = strcmp("-Infinity",
                                                                 local_1f0.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_1f0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToExponential
                                                                      (&local_178,NAN,1,&local_1f0);
                                                    pcVar3 = local_1f0.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar3 = 
                                                  "dc4.ToExponential(Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x35a;
                                                  goto LAB_00832253;
                                                  }
                                                  local_1f0.buffer_.start_[local_1f0.position_] =
                                                       '\0';
                                                  local_1f0.position_ = -1;
                                                  if (local_1f0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0083194e;
                                                  iVar2 = strcmp("NaN",local_1f0.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_1f0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToExponential
                                                                      (&local_178,-NAN,1,&local_1f0)
                                                    ;
                                                    pcVar3 = local_1f0.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar3 = 
                                                  "dc4.ToExponential(-Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x35e;
                                                  goto LAB_00832253;
                                                  }
                                                  local_1f0.buffer_.start_[local_1f0.position_] =
                                                       '\0';
                                                  local_1f0.position_ = -1;
                                                  if (local_1f0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0083194e;
                                                  iVar2 = strcmp("NaN",local_1f0.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    return;
                                                  }
                                                  pcVar4 = "\"NaN\"";
                                                  pcVar6 = "NaN";
                                                  uVar5 = 0x35f;
                                                  }
                                                  else {
                                                    pcVar4 = "\"NaN\"";
                                                    pcVar6 = "NaN";
                                                    uVar5 = 0x35b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"-Infinity\"";
                                                    pcVar6 = "-Infinity";
                                                    uVar5 = 0x357;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"Infinity\"";
                                                    pcVar6 = "Infinity";
                                                    uVar5 = 0x353;
                                                  }
                                                  goto LAB_0083228b;
                                                  }
                                                  pcVar3 = 
                                                  "dc4.ToExponential(Double::Infinity(), 1, &builder)"
                                                  ;
                                                  uVar5 = 0x352;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  pcVar3 = "dc2.ToExponential(1234, 0, &builder)";
                                                  uVar5 = 0x33d;
                                                }
                                              }
                                              else {
                                                pcVar3 = 
                                                "dc2.ToExponential(1000000000000000019884624838656.0, 32, &builder)"
                                                ;
                                                uVar5 = 0x339;
                                              }
                                            }
                                            else {
                                              pcVar3 = 
                                              "dc2.ToExponential(1000000000000000019884624838656.0, -1, &builder)"
                                              ;
                                              uVar5 = 0x335;
                                            }
                                          }
                                          else {
                                            pcVar3 = 
                                            "dc2.ToExponential(123456789000000, 3, &builder)";
                                            uVar5 = 0x331;
                                          }
                                        }
                                        else {
                                          pcVar3 = "dc2.ToExponential(3.1415, 3, &builder)";
                                          uVar5 = 0x32d;
                                        }
                                      }
                                      else {
                                        pcVar3 = "dc2.ToExponential(3.1415, 4, &builder)";
                                        uVar5 = 0x329;
                                      }
                                    }
                                    else {
                                      pcVar3 = "dc2.ToExponential(3.1415, -1, &builder)";
                                      uVar5 = 0x325;
                                    }
                                  }
                                  else {
                                    pcVar3 = "dc2.ToExponential(0.001, 2, &builder)";
                                    uVar5 = 0x321;
                                  }
                                }
                                else {
                                  pcVar3 = "dc2.ToExponential(5.0, 3, &builder)";
                                  uVar5 = 0x31d;
                                }
                              }
                              else {
                                pcVar3 = "dc2.ToExponential(3.12, 1, &builder)";
                                uVar5 = 0x319;
                              }
                            }
                            else {
                              pcVar3 = "dc.ToExponential(0.0000001, 2, &builder)";
                              uVar5 = 0x311;
                            }
                          }
                          else {
                            pcVar3 = "dc.ToExponential(0.000001, 2, &builder)";
                            uVar5 = 0x30d;
                          }
                        }
                        else {
                          pcVar3 = 
                          "dc.ToExponential( max_double, DoubleToStringConverter::kMaxExponentialDigits, &builder)"
                          ;
                          uVar5 = 0x307;
                        }
                      }
                      else {
                        pcVar3 = 
                        "dc.ToExponential( -9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder)"
                        ;
                        uVar5 = 0x2ff;
                      }
                    }
                    else {
                      pcVar3 = 
                      "dc.ToExponential( 9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder)"
                      ;
                      uVar5 = 0x2f8;
                    }
                  }
                  else {
                    pcVar3 = 
                    "dc.ToExponential( 0.0, DoubleToStringConverter::kMaxExponentialDigits, &builder)"
                    ;
                    uVar5 = 0x2f1;
                  }
                }
                else {
                  pcVar3 = "dc.ToExponential(-0.0, 2, &builder)";
                  uVar5 = 0x2eb;
                }
              }
              else {
                pcVar3 = "dc.ToExponential(0.0, 2, &builder)";
                uVar5 = 0x2e7;
              }
            }
            else {
              pcVar3 = "dc.ToExponential(-0.0, 1, &builder)";
              uVar5 = 0x2e3;
            }
          }
          else {
            pcVar3 = "dc.ToExponential(1.2, 1, &builder)";
            uVar5 = 0x2df;
          }
        }
        else {
          pcVar3 = "dc.ToExponential(0.123456, 5, &builder)";
          uVar5 = 0x2db;
        }
      }
      else {
        pcVar3 = "dc.ToExponential(0.0, 1, &builder)";
        uVar5 = 0x2d7;
      }
    }
    else {
      pcVar3 = "dc.ToExponential(0.0, 0, &builder)";
      uVar5 = 0x2d3;
    }
  }
  else {
    pcVar3 = "dc.ToExponential(0.0, 5, &builder)";
    uVar5 = 0x2cf;
  }
LAB_00832253:
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar5,pcVar3);
  abort();
}

Assistant:

TEST(DoubleToExponential) {
  const int kBufferSize = 256;
  char buffer[kBufferSize];
  int flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::UNIQUE_ZERO;
  StringBuilder builder(buffer, kBufferSize);
  DoubleToStringConverter dc(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 5, &builder));
  CHECK_EQ("0.00000e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 0, &builder));
  CHECK_EQ("0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 1, &builder));
  CHECK_EQ("0.0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.123456, 5, &builder));
  CHECK_EQ("1.23456e-1", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(1.2, 1, &builder));
  CHECK_EQ("1.2e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(-0.0, 1, &builder));
  CHECK_EQ("0.0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 2, &builder));
  CHECK_EQ("0.00e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(-0.0, 2, &builder));
  CHECK_EQ("0.00e+0", builder.Finalize());

  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxExponentialDigits == 120);
  builder.Reset();
  CHECK(dc.ToExponential(
      0.0, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("0.00000000000000000000000000000000000000000000000000000000000"
           "0000000000000000000000000000000000000000000000000000000000000e+0",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(
      9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("8.99999999999999918767229449717619953810131273674690656206848"
           "0000000000000000000000000000000000000000000000000000000000000e+59",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(
      -9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("-8.99999999999999918767229449717619953810131273674690656206848"
           "0000000000000000000000000000000000000000000000000000000000000e+59",
           builder.Finalize());

  const double max_double = 1.7976931348623157e308;
  builder.Reset();
  CHECK(dc.ToExponential(
      max_double, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("1.79769313486231570814527423731704356798070567525844996598917"
           "4768031572607800285387605895586327668781715404589535143824642e+308",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.000001, 2, &builder));
  CHECK_EQ("1.00e-6", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0000001, 2, &builder));
  CHECK_EQ("1.00e-7", builder.Finalize());

  // Test the examples in the comments of ToExponential.
  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc2.ToExponential(3.12, 1, &builder));
  CHECK_EQ("3.1e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(5.0, 3, &builder));
  CHECK_EQ("5.000e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(0.001, 2, &builder));
  CHECK_EQ("1.00e-3", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, -1, &builder));
  CHECK_EQ("3.1415e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, 4, &builder));
  CHECK_EQ("3.1415e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, 3, &builder));
  CHECK_EQ("3.142e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(123456789000000, 3, &builder));
  CHECK_EQ("1.235e14", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1000000000000000019884624838656.0, -1, &builder));
  CHECK_EQ("1e30", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1000000000000000019884624838656.0, 32, &builder));
  CHECK_EQ("1.00000000000000001988462483865600e30", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1234, 0, &builder));
  CHECK_EQ("1e3", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc3(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc3.ToExponential(Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(-Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(Double::NaN(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(-Double::NaN(), 1, &builder));

  DoubleToStringConverter dc4(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc4.ToExponential(Double::Infinity(), 1, &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(-Double::Infinity(), 1, &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(-Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());
}